

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_Message_impl.hpp
# Opt level: O3

void __thiscall hrgls::Message::Message(Message *this,hrgls_Message Message)

{
  hrgls_Status hVar1;
  Message_private *pMVar2;
  
  this->m_private = (Message_private *)0x0;
  pMVar2 = (Message_private *)operator_new(0x10);
  pMVar2->Message = (hrgls_Message)0x0;
  pMVar2->status = 0;
  this->m_private = pMVar2;
  if (Message == (hrgls_Message)0x0) {
    pMVar2->status = 0x3ee;
  }
  else {
    hVar1 = hrgls_MessageCopy(pMVar2,Message);
    this->m_private->status = hVar1;
  }
  return;
}

Assistant:

Message::Message(hrgls_Message Message)
  {
    m_private = new Message_private;
    if (!Message) {
      m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
      return;
    }
    m_private->status = hrgls_MessageCopy(&m_private->Message, Message);
  }